

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O2

void __thiscall wasm::SimplifyGlobals::preferEarlierImports(SimplifyGlobals *this)

{
  pointer puVar1;
  Expression *pEVar2;
  Module *pMVar3;
  char *pcVar4;
  Global *pGVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar9;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global_1;
  undefined1 auStack_188 [8];
  Name child;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  Expression **local_158;
  size_t sStack_150;
  pointer local_a8;
  pointer pTStack_a0;
  pointer local_98;
  Function *pFStack_90;
  Module *local_88;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *local_80;
  undefined1 local_78 [8];
  NameNameMap copiedParentMap;
  Name parent;
  
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&copiedParentMap;
  copiedParentMap._M_t._M_impl._0_4_ = 0;
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  puVar1 = (this->module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  for (puVar9 = (this->module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
    pGVar5 = (puVar9->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    auStack_188 = *(undefined1 (*) [8])&(pGVar5->super_Importable).super_Named;
    child.super_IString.str._M_len =
         (size_t)(pGVar5->super_Importable).super_Named.name.super_IString.str._M_str;
    if (((pGVar5->mutable_ == false) &&
        ((pGVar5->super_Importable).module.super_IString.str._M_str == (char *)0x0)) &&
       (pEVar2 = pGVar5->init, pEVar2->_id == GlobalGetId)) {
      copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(pEVar2 + 1);
      pcVar4 = (char *)pEVar2[1].type.id;
      pGVar5 = Module::getGlobal(this->module,(IString)*(IString *)&pEVar2[1]._id);
      if (pGVar5->mutable_ == false) {
        pmVar6 = std::
                 map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                               *)local_78,(key_type *)auStack_188);
        (pmVar6->super_IString).str._M_len =
             copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
        (pmVar6->super_IString).str._M_str = pcVar4;
      }
    }
  }
  if (copiedParentMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    puVar1 = (this->module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar9 = (this->module->globals).
                  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1)
    {
      pGVar5 = (puVar9->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      auStack_188 = *(undefined1 (*) [8])&(pGVar5->super_Importable).super_Named;
      child.super_IString.str._M_len =
           (size_t)(pGVar5->super_Importable).super_Named.name.super_IString.str._M_str;
      sVar7 = std::
              map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::count((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                       *)local_78,(key_type *)auStack_188);
      if (sVar7 != 0) {
        while( true ) {
          pmVar6 = std::
                   map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                 *)local_78,(key_type *)auStack_188);
          sVar7 = std::
                  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  ::count((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                           *)local_78,pmVar6);
          if (sVar7 == 0) break;
          pmVar6 = std::
                   map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                 *)local_78,(key_type *)auStack_188);
          pmVar6 = std::
                   map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                 *)local_78,pmVar6);
          pmVar8 = std::
                   map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                 *)local_78,(key_type *)auStack_188);
          pcVar4 = (pmVar6->super_IString).str._M_str;
          (pmVar8->super_IString).str._M_len = (pmVar6->super_IString).str._M_len;
          (pmVar8->super_IString).str._M_str = pcVar4;
        }
      }
    }
    child.super_IString.str._M_str = (char *)&local_168;
    child.super_IString.str._M_len = 0;
    local_168._M_local_buf[0] = '\0';
    local_158 = (Expression **)0x0;
    sStack_150 = 0;
    local_a8 = (pointer)0x0;
    pTStack_a0 = (pointer)0x0;
    local_98 = (pointer)0x0;
    pFStack_90 = (Function *)0x0;
    local_88 = (Module *)0x0;
    auStack_188 = (undefined1  [8])&PTR__WalkerPass_00e212b0;
    pMVar3 = this->module;
    local_80 = (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                *)local_78;
    Pass::setPassRunner((Pass *)auStack_188,(this->super_Pass).runner);
    (**(_func_int **)((long)auStack_188 + 0x10))((Pass *)auStack_188,pMVar3);
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseModifier,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseModifier,_void>_>_>
    ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseModifier,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseModifier,_void>_>_>
                   *)auStack_188);
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_78);
  return;
}

Assistant:

void preferEarlierImports() {
    // Optimize uses of immutable globals, prefer the earlier import when
    // there is a copy.
    NameNameMap copiedParentMap;
    for (auto& global : module->globals) {
      auto child = global->name;
      if (!global->mutable_ && !global->imported()) {
        if (auto* get = global->init->dynCast<GlobalGet>()) {
          auto parent = get->name;
          if (!module->getGlobal(get->name)->mutable_) {
            copiedParentMap[child] = parent;
          }
        }
      }
    }
    if (!copiedParentMap.empty()) {
      // Go all the way back.
      for (auto& global : module->globals) {
        auto child = global->name;
        if (copiedParentMap.count(child)) {
          while (copiedParentMap.count(copiedParentMap[child])) {
            copiedParentMap[child] = copiedParentMap[copiedParentMap[child]];
          }
        }
      }
      // Apply to the gets.
      GlobalUseModifier(&copiedParentMap).run(getPassRunner(), module);
    }
  }